

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall
CGameClient::CClientData::Reset(CClientData *this,CGameClient *pGameClient,int ClientID)

{
  CSkinPart *pCVar1;
  undefined8 *puVar2;
  undefined8 in_RSI;
  CSkins *in_RDI;
  long in_FS_OFFSET;
  int p;
  int local_30;
  CSkins *this_00;
  anon_union_4_2_94730227_for_vector4_base<float>_1 in_stack_ffffffffffffffe8;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 in_stack_ffffffffffffffec;
  CGameClient *in_stack_fffffffffffffff0;
  CClientData *this_01;
  
  this_01 = *(CClientData **)(in_FS_OFFSET + 0x28);
  *(undefined1 *)&(in_RDI->super_CComponent)._vptr_CComponent = 0;
  *(undefined1 *)
   ((long)&in_RDI->m_aaSkinParts[2].
           super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>.list + 1) = 0;
  *(undefined4 *)
   ((long)&in_RDI->m_aaSkinParts[5].
           super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>.list + 4) =
       0xffffffff;
  in_RDI[2].m_aaSkinParts[3].super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>.
  list_size = 0;
  in_RDI[4].m_aaSkinParts[2].super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>.
  list_size = 0;
  in_RDI[2].m_aaSkinParts[3].super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>.
  num_elements = 0;
  *(undefined4 *)
   &in_RDI[2].m_aaSkinParts[4].super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>
    .list = 0xffffffff;
  *(undefined1 *)
   &in_RDI[4].m_aaSkinParts[2].super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>
    .num_elements = 0;
  *(undefined1 *)
   ((long)&in_RDI[4].m_aaSkinParts[2].
           super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>.num_elements + 1) =
       0;
  *(undefined1 *)
   ((long)&in_RDI[4].m_aaSkinParts[2].
           super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>.num_elements + 2) =
       0;
  in_RDI[3].m_DummySkin.m_aUseCustomColors[2] = -1;
  this_00 = in_RDI;
  for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
    *(undefined4 *)
     ((long)&in_RDI[2].m_aaSkinParts[2].
             super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>.list +
     (long)local_30 * 4) = 0;
    pCVar1 = CSkins::GetSkinPart(this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    ((CTextureHandle *)(in_RDI[3].m_aaSkinParts + -1))[local_30].m_Id =
         (pCVar1->m_ColorTexture).m_Id;
    vector4_base<float>::vector4_base
              ((vector4_base<float> *)&stack0xffffffffffffffe8,1.0,1.0,1.0,1.0);
    puVar2 = (undefined8 *)
             ((long)&in_RDI[3].m_aaSkinParts[(long)local_30 + 2].
                     super_array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>.list + 4)
    ;
    *puVar2 = CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    puVar2[1] = in_stack_fffffffffffffff0;
  }
  UpdateRenderInfo(this_01,in_stack_fffffffffffffff0,(int)in_stack_ffffffffffffffec,
                   (bool)in_stack_ffffffffffffffe8._3_1_);
  if (*(CClientData **)(in_FS_OFFSET + 0x28) == this_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::CClientData::Reset(CGameClient *pGameClient, int ClientID)
{
	m_aName[0] = 0;
	m_aClan[0] = 0;
	m_Country = -1;
	m_Team = 0;
	m_Angle = 0;
	m_Emoticon = 0;
	m_EmoticonStart = -1;
	m_Active = false;
	m_ChatIgnore = false;
	m_Friend = false;
	m_Evolved.m_Tick = -1;
	for(int p = 0; p < NUM_SKINPARTS; p++)
	{
		m_SkinPartIDs[p] = 0;
		m_SkinInfo.m_aTextures[p] = pGameClient->m_pSkins->GetSkinPart(p, 0)->m_ColorTexture;
		m_SkinInfo.m_aColors[p] = vec4(1.0f, 1.0f, 1.0f , 1.0f);
	}
	UpdateRenderInfo(pGameClient, ClientID, false);
}